

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::
SmallVector<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_10U>
::SmallVector(SmallVector<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_10U>
              *this,SmallVector<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_10U>
                    *RHS)

{
  U *pUVar1;
  
  pUVar1 = &(this->
            super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed>
            ).
            super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_false>
            .
            super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_void>
            .FirstEl;
  (this->
  super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed>
  ).
  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_false>
  .
  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_void>
  .super_SmallVectorBase.BeginX = pUVar1;
  (this->
  super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed>
  ).
  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_false>
  .
  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_void>
  .super_SmallVectorBase.EndX = pUVar1;
  (this->
  super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed>
  ).
  super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_false>
  .
  super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_void>
  .super_SmallVectorBase.CapacityX = this + 1;
  if ((RHS->
      super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed>
      ).
      super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_false>
      .
      super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_void>
      .super_SmallVectorBase.BeginX !=
      (RHS->
      super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed>
      ).
      super_SmallVectorTemplateBase<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_false>
      .
      super_SmallVectorTemplateCommon<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed,_void>
      .super_SmallVectorBase.EndX) {
    SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed>
    ::operator=(&this->
                 super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed>
                ,&RHS->
                  super_SmallVectorImpl<Fixpp::MessageBase<Fixpp::FieldRef,_Fixpp::TagT<865U,_Fixpp::Type::Int>,_Fixpp::TagT<866U,_Fixpp::Type::String>,_Fixpp::TagT<867U,_Fixpp::Type::Float>,_Fixpp::TagT<868U,_Fixpp::Type::String>_>::Unparsed>
               );
  }
  return;
}

Assistant:

SmallVector(SmallVector &&RHS) : SmallVectorImpl<T>(N) {
    if (!RHS.empty())
      SmallVectorImpl<T>::operator=(::std::move(RHS));
  }